

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

QSize __thiscall QMdi::ControllerWidget::sizeHint(ControllerWidget *this)

{
  QStyle *pQVar1;
  QSize QVar2;
  long in_FS_OFFSET;
  QStyleOptionComplex opt;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QPalettePrivate *pQStack_40;
  undefined1 *local_38;
  QObject *pQStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::ensurePolished(&this->super_QWidget);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)&local_68,1,0xf0000);
  QStyleOption::initFrom((QStyleOption *)&local_68,&this->super_QWidget);
  local_28 = (undefined1 *)
             (ulong)(this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                    super_QFlagsStorage<QStyle::SubControl>.i;
  pQVar1 = QWidget::style(&this->super_QWidget);
  local_6c = (**(code **)(*(long *)pQVar1 + 0xe0))
                       (pQVar1,0x5c,(QStyleOptionComplex *)&local_68,this);
  local_70 = local_6c * 3;
  pQVar1 = QWidget::style(&this->super_QWidget);
  QVar2 = (QSize)(**(code **)(*(long *)pQVar1 + 0xe8))
                           (pQVar1,0x15,(QStyleOptionComplex *)&local_68,&local_70,this);
  QStyleOption::~QStyleOption((QStyleOption *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize ControllerWidget::sizeHint() const
{
    ensurePolished();
    QStyleOptionComplex opt;
    initStyleOption(&opt);
    const int buttonSize = style()->pixelMetric(QStyle::PM_TitleBarButtonSize, &opt, this);
    QSize size(3 * buttonSize, buttonSize);
    return style()->sizeFromContents(QStyle::CT_MdiControls, &opt, size, this);
}